

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_pause(http_s *h,_func_void_http_pause_handle_s_ptr *task)

{
  void *pvVar1;
  uintptr_t uVar2;
  void *pvVar3;
  undefined8 *arg1;
  
  if ((h != (http_s *)0x0) && (((h->method != 0 || (h->status_str != 0)) || (h->status == 0)))) {
    pvVar1 = (h->private_data).vtbl;
    uVar2 = (h->private_data).flag;
    arg1 = (undefined8 *)fio_malloc(0x28);
    pvVar3 = h->udata;
    *arg1 = *(undefined8 *)(uVar2 + 0x30);
    arg1[1] = h;
    arg1[2] = pvVar3;
    arg1[3] = 0;
    arg1[4] = 0;
    (**(code **)((long)pvVar1 + 0x38))(h,uVar2);
    fio_defer(http_pause_wrapper,arg1,task);
    return;
  }
  return;
}

Assistant:

void http_pause(http_s *h, void (*task)(http_pause_handle_s *http)) {
  if (HTTP_INVALID_HANDLE(h)) {
    return;
  }
  http_fio_protocol_s *p = (http_fio_protocol_s *)h->private_data.flag;
  http_vtable_s *vtbl = (http_vtable_s *)h->private_data.vtbl;
  http_pause_handle_s *http = fio_malloc(sizeof(*http));
  *http = (http_pause_handle_s){
      .uuid = p->uuid,
      .h = h,
      .udata = h->udata,
  };
  vtbl->http_on_pause(h, p);
  fio_defer(http_pause_wrapper, http, (void *)((uintptr_t)task));
}